

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_DoTimerB(ym3438_t *chip)

{
  byte bVar1;
  Bit8u BVar2;
  ushort uVar3;
  
  bVar1 = chip->timer_b_overflow;
  if (chip->cycles == 2) {
    BVar2 = chip->timer_b_load_lock;
    chip->timer_b_load_lock = chip->timer_b_load;
    uVar3 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
    chip->timer_b_load_latch = (chip->timer_b_load != '\0' && BVar2 == '\0') | bVar1;
  }
  else {
    uVar3 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
    chip->timer_b_load_latch = bVar1;
    if (chip->cycles == 1) {
      chip->timer_b_subcnt = chip->timer_b_subcnt + '\x01';
    }
  }
  if (((chip->timer_b_subcnt == 0x10) && (chip->timer_b_load_lock != '\0')) ||
     (chip->mode_test_21[2] != '\0')) {
    uVar3 = uVar3 + 1;
  }
  chip->timer_b_subcnt = chip->timer_b_subcnt & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag = chip->timer_b_overflow_flag | bVar1 & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(uVar3 >> 8);
  chip->timer_b_cnt = uVar3 & 0xff;
  return;
}

Assistant:

void NOPN2_DoTimerB(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_b_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_b_load_lock && chip->timer_b_load);
        chip->timer_b_load_lock = chip->timer_b_load;
    }
    /* Load counter */
    if (chip->timer_b_load_latch)
    {
        time = chip->timer_b_reg;
    }
    else
    {
        time = chip->timer_b_cnt;
    }
    chip->timer_b_load_latch = load;
    /* Increase counter */
    if (chip->cycles == 1)
    {
        chip->timer_b_subcnt++;
    }
    if ((chip->timer_b_subcnt == 0x10 && chip->timer_b_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    chip->timer_b_subcnt &= 0x0f;
    /* Set overflow flag */
    if (chip->timer_b_reset)
    {
        chip->timer_b_reset = 0;
        chip->timer_b_overflow_flag = 0;
    }
    else
    {
        chip->timer_b_overflow_flag |= chip->timer_b_overflow & chip->timer_b_enable;
    }
    chip->timer_b_overflow = (time >> 8);
    chip->timer_b_cnt = time & 0xff;
}